

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O2

void * __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
try_allocate_page<(density::detail::page_allocation_type)1>
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,
          progress_guarantee i_progress_guarantee)

{
  uintptr_t uint_pointer;
  PageFooter *pPVar1;
  
  process_pending_unpins(this,i_progress_guarantee);
  pPVar1 = PageStack::pop_unpinned(&this->m_private_zeroed_page_stack);
  if (pPVar1 == (PageFooter *)0x0) {
    pPVar1 = WF_PageStack::try_pop_unpinned(&this->m_current_slot->m_zeroed_page_stack);
    if (pPVar1 == (PageFooter *)0x0) {
      pPVar1 = try_steal_and_allocate(this,zeroed);
      if (pPVar1 == (PageFooter *)0x0) {
        pPVar1 = allocate_page_slow_path(this,zeroed,i_progress_guarantee);
      }
    }
  }
  return (void *)((ulong)pPVar1 & 0xffffffffffff0000);
}

Assistant:

void * try_allocate_page(progress_guarantee i_progress_guarantee) noexcept
            {
                process_pending_unpins(i_progress_guarantee);

                // try from the private stack...
                auto * new_page = get_private_stack(ALLOCATION_TYPE).pop_unpinned();
                if (new_page == nullptr)
                {
                    // ...then from the current slot...
                    new_page = m_current_slot->get_stack(ALLOCATION_TYPE).try_pop_unpinned();
                    if (new_page == nullptr)
                    {
                        // ...else try to steal all the pages from the victim slot...
                        new_page = try_steal_and_allocate(ALLOCATION_TYPE);

                        // if still do not have a page, we go to the next level
                        if (new_page == nullptr)
                        {
                            new_page =
                              allocate_page_slow_path(ALLOCATION_TYPE, i_progress_guarantee);
                        }
                    }
                }

                // flush any pending write
                if (enable_relaxed_atomics)
                    std::atomic_thread_fence(std::memory_order_release);

                return address_lower_align(new_page, page_alignment);
            }